

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ColumnMetaData * __thiscall
duckdb_parquet::ColumnMetaData::operator=(ColumnMetaData *this,ColumnMetaData *other125)

{
  Statistics *in_RSI;
  ColumnMetaData *in_RDI;
  
  in_RDI->type = *(type *)&in_RSI->max;
  duckdb::vector<duckdb_parquet::Encoding::type,_true>::operator=
            ((vector<duckdb_parquet::Encoding::type,_true> *)in_RSI,
             (vector<duckdb_parquet::Encoding::type,_true> *)in_RDI);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RSI,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RDI);
  in_RDI->codec = *(type *)&in_RSI->field_0x40;
  in_RDI->num_values = in_RSI->null_count;
  in_RDI->total_uncompressed_size = in_RSI->distinct_count;
  in_RDI->total_compressed_size = *(int64_t *)&in_RSI->max_value;
  duckdb::vector<duckdb_parquet::KeyValue,_true>::operator=
            ((vector<duckdb_parquet::KeyValue,_true> *)in_RSI,
             (vector<duckdb_parquet::KeyValue,_true> *)in_RDI);
  in_RDI->data_page_offset = *(int64_t *)&in_RSI->min_value;
  in_RDI->index_page_offset = *(int64_t *)&in_RSI->field_0x80;
  in_RDI->dictionary_page_offset = *(int64_t *)&in_RSI->field_0x88;
  Statistics::operator=(in_RSI,(Statistics *)in_RDI);
  duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::operator=
            ((vector<duckdb_parquet::PageEncodingStats,_true> *)in_RSI,
             (vector<duckdb_parquet::PageEncodingStats,_true> *)in_RDI);
  in_RDI->bloom_filter_offset = *(int64_t *)&in_RSI[2].max;
  in_RDI->bloom_filter_length = *(int32_t *)&in_RSI[2].field_0x10;
  SizeStatistics::operator=((SizeStatistics *)in_RSI,(SizeStatistics *)in_RDI);
  in_RDI->__isset = (_ColumnMetaData__isset)in_RSI[2].field_0x60;
  return in_RDI;
}

Assistant:

ColumnMetaData& ColumnMetaData::operator=(const ColumnMetaData& other125) {
  type = other125.type;
  encodings = other125.encodings;
  path_in_schema = other125.path_in_schema;
  codec = other125.codec;
  num_values = other125.num_values;
  total_uncompressed_size = other125.total_uncompressed_size;
  total_compressed_size = other125.total_compressed_size;
  key_value_metadata = other125.key_value_metadata;
  data_page_offset = other125.data_page_offset;
  index_page_offset = other125.index_page_offset;
  dictionary_page_offset = other125.dictionary_page_offset;
  statistics = other125.statistics;
  encoding_stats = other125.encoding_stats;
  bloom_filter_offset = other125.bloom_filter_offset;
  bloom_filter_length = other125.bloom_filter_length;
  size_statistics = other125.size_statistics;
  __isset = other125.__isset;
  return *this;
}